

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_k64(jit_State *J,IROp op,uint64_t u64)

{
  ushort uVar1;
  int iVar2;
  undefined4 *puVar3;
  jit_State *in_RDX;
  uint in_ESI;
  long in_RDI;
  IRType t;
  IRRef ref;
  IRIns *cir;
  IRIns *ir;
  IRRef ref_1;
  uint local_3c;
  
  iVar2 = 0x15;
  if (in_ESI == 0x1c) {
    iVar2 = 0xe;
  }
  uVar1 = *(ushort *)(in_RDI + 0x182 + (ulong)in_ESI * 2);
  while (local_3c = (uint)uVar1, local_3c != 0) {
    if (*(jit_State **)(*(long *)(in_RDI + 0x10) + 8 + (ulong)local_3c * 8) == in_RDX)
    goto LAB_00159c13;
    uVar1 = *(ushort *)(*(long *)(in_RDI + 0x10) + 6 + (ulong)local_3c * 8);
  }
  local_3c = *(int *)(in_RDI + 0x18) - 2;
  if (local_3c < *(uint *)(in_RDI + 0x144)) {
    lj_ir_growbot(in_RDX);
  }
  *(uint *)(in_RDI + 0x18) = local_3c;
  puVar3 = (undefined4 *)(*(long *)(in_RDI + 0x10) + (ulong)local_3c * 8);
  *(jit_State **)(puVar3 + 2) = in_RDX;
  *(char *)(puVar3 + 1) = (char)iVar2;
  *(char *)((long)puVar3 + 5) = (char)in_ESI;
  *puVar3 = 0;
  *(undefined2 *)((long)puVar3 + 6) = *(undefined2 *)(in_RDI + 0x182 + (ulong)in_ESI * 2);
  *(short *)(in_RDI + 0x182 + (ulong)in_ESI * 2) = (short)local_3c;
LAB_00159c13:
  return local_3c + iVar2 * 0x1000000;
}

Assistant:

TRef lj_ir_k64(jit_State *J, IROp op, uint64_t u64)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
  IRType t = op == IR_KNUM ? IRT_NUM : IRT_I64;
  for (ref = J->chain[op]; ref; ref = cir[ref].prev)
    if (ir_k64(&cir[ref])->u64 == u64)
      goto found;
  ref = ir_nextk64(J);
  ir = IR(ref);
  ir[1].tv.u64 = u64;
  ir->t.irt = t;
  ir->o = op;
  ir->op12 = 0;
  ir->prev = J->chain[op];
  J->chain[op] = (IRRef1)ref;
found:
  return TREF(ref, t);
}